

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O1

void __thiscall
duckdb::StandardWriterPageState<signed_char,_int,_duckdb::ParquetCastOperator>::
StandardWriterPageState
          (StandardWriterPageState<signed_char,_int,_duckdb::ParquetCastOperator> *this,
          idx_t total_value_count,idx_t total_string_size,type encoding_p,
          PrimitiveDictionary<signed_char,_int,_duckdb::ParquetCastOperator> *dictionary_p)

{
  byte bVar1;
  pointer *__ptr;
  uint32_t uVar2;
  
  (this->super_ColumnWriterPageState)._vptr_ColumnWriterPageState =
       (_func_int **)&PTR__StandardWriterPageState_024bdd30;
  this->encoding = encoding_p;
  uVar2 = 0;
  this->dbp_initialized = false;
  (this->dbp_encoder).total_value_count = total_value_count;
  (this->dbp_encoder).count = 0;
  this->dlba_initialized = false;
  (this->dlba_encoder).dbp_encoder.total_value_count = total_value_count;
  (this->dlba_encoder).dbp_encoder.count = 0;
  (this->dlba_encoder).total_string_size = total_string_size;
  AllocatedData::AllocatedData(&(this->dlba_encoder).buffer);
  this->bss_initialized = false;
  (this->dlba_encoder).stream.
  super_unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
  super___uniq_ptr_impl<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>.
  super__Head_base<0UL,_duckdb::MemoryStream_*,_false>._M_head_impl = (MemoryStream *)0x0;
  (this->bss_encoder).total_value_count = total_value_count;
  (this->bss_encoder).bit_width = 4;
  (this->bss_encoder).count = 0;
  AllocatedData::AllocatedData(&(this->bss_encoder).buffer);
  this->dictionary = dictionary_p;
  this->dict_written_value = false;
  if (dictionary_p->size != 0) {
    bVar1 = 0;
    do {
      bVar1 = bVar1 + 1;
    } while (dictionary_p->size >> (bVar1 & 0x3f) != 0);
    uVar2 = (uint32_t)bVar1;
  }
  this->dict_bit_width = uVar2;
  (this->dict_encoder).bit_width = uVar2;
  (this->dict_encoder).byte_width = uVar2 + 7 >> 3;
  switchD_0105b559::default((this->dict_encoder).bp_block,0,0x800);
  return;
}

Assistant:

explicit StandardWriterPageState(const idx_t total_value_count, const idx_t total_string_size,
	                                 duckdb_parquet::Encoding::type encoding_p,
	                                 const PrimitiveDictionary<SRC, TGT, OP> &dictionary_p)
	    : encoding(encoding_p), dbp_initialized(false), dbp_encoder(total_value_count), dlba_initialized(false),
	      dlba_encoder(total_value_count, total_string_size), bss_initialized(false),
	      bss_encoder(total_value_count, sizeof(TGT)), dictionary(dictionary_p), dict_written_value(false),
	      dict_bit_width(RleBpDecoder::ComputeBitWidth(dictionary.GetSize())), dict_encoder(dict_bit_width) {
	}